

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O0

ssize_t amqp_ssl_socket_send(void *base,void *buf,size_t len,int flags)

{
  int iVar1;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  int res;
  amqp_ssl_socket_t *self;
  undefined4 local_34;
  undefined8 local_8;
  
  if (*(int *)(in_RDI + 0x10) == -1) {
    local_8 = -0x11;
  }
  else if (in_RDX < 0x80000000) {
    ERR_clear_error();
    *(undefined4 *)(in_RDI + 0x28) = 0;
    local_34 = SSL_write(*(SSL **)(in_RDI + 0x18),in_RSI,(int)in_RDX);
    if (local_34 < 1) {
      iVar1 = SSL_get_error(*(SSL **)(in_RDI + 0x18),local_34);
      *(int *)(in_RDI + 0x28) = iVar1;
      iVar1 = *(int *)(in_RDI + 0x28);
      if (iVar1 == 2) {
        local_34 = -0x1301;
      }
      else if (iVar1 == 3) {
        local_34 = -0x1302;
      }
      else if (iVar1 == 6) {
        local_34 = -7;
      }
      else {
        local_34 = -0x200;
      }
    }
    else {
      *(undefined4 *)(in_RDI + 0x28) = 0;
    }
    local_8 = (long)local_34;
  }
  else {
    local_8 = -10;
  }
  return local_8;
}

Assistant:

static ssize_t amqp_ssl_socket_send(void *base, const void *buf, size_t len,
                                    AMQP_UNUSED int flags) {
  struct amqp_ssl_socket_t *self = (struct amqp_ssl_socket_t *)base;
  int res;
  if (-1 == self->sockfd) {
    return AMQP_STATUS_SOCKET_CLOSED;
  }

  /* SSL_write takes an int for length of buffer, protect against len being
   * larger than larger than what SSL_write can take */
  if (len > INT_MAX) {
    return AMQP_STATUS_INVALID_PARAMETER;
  }

  ERR_clear_error();
  self->internal_error = 0;

  /* This will only return on error, or once the whole buffer has been
   * written to the SSL stream. See SSL_MODE_ENABLE_PARTIAL_WRITE */
  res = SSL_write(self->ssl, buf, (int)len);
  if (0 >= res) {
    self->internal_error = SSL_get_error(self->ssl, res);
    /* TODO: Close connection if it isn't already? */
    /* TODO: Possibly be more intelligent in reporting WHAT went wrong */
    switch (self->internal_error) {
      case SSL_ERROR_WANT_READ:
        res = AMQP_PRIVATE_STATUS_SOCKET_NEEDREAD;
        break;
      case SSL_ERROR_WANT_WRITE:
        res = AMQP_PRIVATE_STATUS_SOCKET_NEEDWRITE;
        break;
      case SSL_ERROR_ZERO_RETURN:
        res = AMQP_STATUS_CONNECTION_CLOSED;
        break;
      default:
        res = AMQP_STATUS_SSL_ERROR;
        break;
    }
  } else {
    self->internal_error = 0;
  }

  return (ssize_t)res;
}